

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

int spin_acquire_lock(int *sl)

{
  int iVar1;
  bool bVar2;
  undefined4 local_14;
  int spins;
  int *sl_local;
  
  local_14 = 0;
  while( true ) {
    bVar2 = true;
    if (*sl == 0) {
      LOCK();
      iVar1 = *sl;
      *sl = 1;
      UNLOCK();
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_14 = local_14 + 1;
    if ((local_14 & 0x3f) == 0) {
      sched_yield();
    }
  }
  return 0;
}

Assistant:

static int spin_acquire_lock(int *sl) {
  int spins = 0;
  while (*(volatile int *)sl != 0 || CAS_LOCK(sl)) {
    if ((++spins & SPINS_PER_YIELD) == 0) {
      SPIN_LOCK_YIELD;
    }
  }
  return 0;
}